

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkPairDetector.cpp
# Opt level: O3

void __thiscall
btGjkPairDetector::getClosestPointsNonVirtual
          (btGjkPairDetector *this,ClosestPointInput *input,Result *output,btIDebugDraw *debugDraw)

{
  btVector3 *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  btConvexPenetrationDepthSolver *pbVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  int iVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  btVector3 bVar29;
  btVector3 bVar30;
  ulong local_1f8;
  undefined8 uStack_1f0;
  float local_1e8;
  btVector3 tmpPointOnA;
  btVector3 seperatingAxisInB;
  btVector3 qWorld;
  btVector3 seperatingAxisInA;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  float fStack_150;
  undefined4 uStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  btVector3 newCachedSeparatingAxis;
  btVector3 w;
  float local_78;
  float fStack_74;
  float local_68;
  
  this->m_cachedSeparatingDistance = 0.0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_148 = *(undefined8 *)(input->m_transformA).m_basis.m_el[0].m_floats;
  uStack_140 = *(undefined8 *)((input->m_transformA).m_basis.m_el[0].m_floats + 2);
  local_138 = *(undefined8 *)(input->m_transformA).m_basis.m_el[1].m_floats;
  uStack_130 = *(undefined8 *)((input->m_transformA).m_basis.m_el[1].m_floats + 2);
  local_128 = *(undefined8 *)(input->m_transformA).m_basis.m_el[2].m_floats;
  uStack_120 = *(undefined8 *)((input->m_transformA).m_basis.m_el[2].m_floats + 2);
  uVar2 = *(undefined8 *)(input->m_transformA).m_origin.m_floats;
  uVar3 = *(undefined8 *)((input->m_transformA).m_origin.m_floats + 2);
  local_188 = *(undefined8 *)(input->m_transformB).m_basis.m_el[0].m_floats;
  uStack_180 = *(undefined8 *)((input->m_transformB).m_basis.m_el[0].m_floats + 2);
  local_178 = *(undefined8 *)(input->m_transformB).m_basis.m_el[1].m_floats;
  uStack_170 = *(undefined8 *)((input->m_transformB).m_basis.m_el[1].m_floats + 2);
  local_168 = *(undefined8 *)(input->m_transformB).m_basis.m_el[2].m_floats;
  uStack_160 = *(undefined8 *)((input->m_transformB).m_basis.m_el[2].m_floats + 2);
  uVar4 = *(undefined8 *)(input->m_transformB).m_origin.m_floats;
  uVar17 = *(undefined8 *)((input->m_transformB).m_origin.m_floats + 2);
  fStack_110 = (float)uVar3;
  fStack_150 = (float)uVar17;
  fVar13 = (float)uVar2;
  fVar28 = (float)((ulong)uVar2 >> 0x20);
  fVar21 = (float)uVar4;
  fVar16 = (float)((ulong)uVar4 >> 0x20);
  fVar22 = (fVar13 + fVar21) * 0.5;
  fVar23 = (fVar28 + fVar16) * 0.5;
  fVar24 = (fStack_110 + fStack_150) * 0.5;
  local_118 = CONCAT44(fVar28 - fVar23,fVar13 - fVar22);
  fStack_10c = (float)((ulong)uVar3 >> 0x20);
  _fStack_110 = CONCAT44(fStack_10c,fStack_110 - fVar24);
  local_158 = CONCAT44(fVar16 - fVar23,fVar21 - fVar22);
  _fStack_150 = CONCAT44((int)((ulong)uVar17 >> 0x20),fStack_150 - fVar24);
  if ((this->m_minkowskiA->super_btCollisionShape).m_shapeType - 0x11U < 2) {
    bVar11 = (this->m_minkowskiB->super_btCollisionShape).m_shapeType - 0x11U < 2;
  }
  else {
    bVar11 = false;
  }
  gNumGjkChecks = gNumGjkChecks + 1;
  fVar13 = 0.0;
  fVar28 = 0.0;
  if (this->m_ignoreMargin == false) {
    fVar13 = this->m_marginB;
    fVar28 = this->m_marginA;
  }
  pbVar1 = &this->m_cachedSeparatingAxis;
  (this->m_cachedSeparatingAxis).m_floats[0] = 0.0;
  (this->m_cachedSeparatingAxis).m_floats[1] = 1.0;
  (this->m_cachedSeparatingAxis).m_floats[2] = 0.0;
  (this->m_cachedSeparatingAxis).m_floats[3] = 0.0;
  this->m_degenerateSimplex = 0;
  this->m_lastUsedMethod = -1;
  this->m_curIter = 0;
  fVar21 = fVar28 + fVar13;
  btVoronoiSimplexSolver::reset(this->m_simplexSolver);
  local_1e8 = 1e+18;
  do {
    fVar15 = (this->m_cachedSeparatingAxis).m_floats[0];
    fVar16 = (this->m_cachedSeparatingAxis).m_floats[1];
    fVar25 = -fVar15;
    fVar12 = (this->m_cachedSeparatingAxis).m_floats[2];
    uVar2 = *(undefined8 *)(input->m_transformA).m_basis.m_el[0].m_floats;
    uVar3 = *(undefined8 *)(input->m_transformA).m_basis.m_el[1].m_floats;
    uVar4 = *(undefined8 *)(input->m_transformA).m_basis.m_el[2].m_floats;
    seperatingAxisInA.m_floats[0] =
         (fVar25 * (float)uVar2 - (float)uVar3 * fVar16) - (float)uVar4 * fVar12;
    seperatingAxisInA.m_floats[1] =
         (fVar25 * (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar3 >> 0x20) * fVar16) -
         (float)((ulong)uVar4 >> 0x20) * fVar12;
    seperatingAxisInA.m_floats[2] =
         ((input->m_transformA).m_basis.m_el[0].m_floats[2] * fVar25 -
         (input->m_transformA).m_basis.m_el[1].m_floats[2] * fVar16) -
         (input->m_transformA).m_basis.m_el[2].m_floats[2] * fVar12;
    seperatingAxisInA.m_floats[3] = 0.0;
    uVar2 = *(undefined8 *)(input->m_transformB).m_basis.m_el[0].m_floats;
    uVar3 = *(undefined8 *)(input->m_transformB).m_basis.m_el[1].m_floats;
    uVar4 = *(undefined8 *)(input->m_transformB).m_basis.m_el[2].m_floats;
    uVar17 = 0;
    seperatingAxisInB.m_floats[1] =
         (float)((ulong)uVar4 >> 0x20) * fVar12 +
         fVar15 * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar3 >> 0x20) * fVar16;
    seperatingAxisInB.m_floats[0] =
         (float)uVar4 * fVar12 + fVar15 * (float)uVar2 + (float)uVar3 * fVar16;
    seperatingAxisInB.m_floats[2] =
         fVar12 * (input->m_transformB).m_basis.m_el[2].m_floats[2] +
         fVar15 * (input->m_transformB).m_basis.m_el[0].m_floats[2] +
         fVar16 * (input->m_transformB).m_basis.m_el[1].m_floats[2];
    seperatingAxisInB.m_floats[3] = 0.0;
    bVar29 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                       (this->m_minkowskiA,&seperatingAxisInA);
    local_108 = bVar29.m_floats._8_8_;
    uStack_f0 = extraout_XMM0_Qb;
    local_f8 = (undefined1  [8])bVar29.m_floats._0_8_;
    uStack_100 = uVar17;
    bVar29 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                       (this->m_minkowskiB,&seperatingAxisInB);
    fVar18 = (float)local_118 +
             (float)uStack_140 * (float)local_108 +
             (float)local_148 * (float)local_f8._0_4_ + local_148._4_4_ * (float)local_f8._4_4_;
    fVar19 = (float)((ulong)local_118 >> 0x20) +
             (float)uStack_130 * (float)local_108 +
             (float)local_138 * (float)local_f8._0_4_ + local_138._4_4_ * (float)local_f8._4_4_;
    tmpPointOnA.m_floats[1] = fVar19;
    tmpPointOnA.m_floats[0] = fVar18;
    uVar2 = tmpPointOnA.m_floats._0_8_;
    fVar16 = bVar29.m_floats[0];
    fVar15 = bVar29.m_floats[1];
    fVar20 = bVar29.m_floats[2];
    fVar12 = (float)local_158 +
             (float)uStack_180 * fVar20 + (float)local_188 * fVar16 + local_188._4_4_ * fVar15;
    fVar25 = (float)((ulong)local_158 >> 0x20) +
             (float)uStack_170 * fVar20 + (float)local_178 * fVar16 + local_178._4_4_ * fVar15;
    fVar14 = fStack_110 +
             (float)uStack_120 * (float)local_108 +
             (float)local_128 * (float)local_f8._0_4_ + local_128._4_4_ * (float)local_f8._4_4_;
    fVar16 = fStack_150 +
             (float)uStack_160 * fVar20 + (float)local_168 * fVar16 + local_168._4_4_ * fVar15;
    tmpPointOnA.m_floats[2] = fVar14;
    tmpPointOnA.m_floats[3] = 0.0;
    qWorld.m_floats[1] = fVar25;
    qWorld.m_floats[0] = fVar12;
    bVar29.m_floats[2] = fVar16;
    bVar29.m_floats[0] = fVar12;
    bVar29.m_floats[1] = fVar25;
    bVar29.m_floats[3] = 0.0;
    if (bVar11) {
      tmpPointOnA.m_floats[2] = 0.0;
      tmpPointOnA.m_floats[3] = 0.0;
      tmpPointOnA.m_floats = (btScalar  [4])CONCAT88(tmpPointOnA.m_floats._8_8_,uVar2);
      qWorld.m_floats[2] = 0.0;
      qWorld.m_floats[3] = 0.0;
      fVar14 = 0.0;
      fVar16 = 0.0;
      bVar29.m_floats = qWorld.m_floats;
    }
    qWorld.m_floats = bVar29.m_floats;
    w.m_floats[1] = fVar19 - fVar25;
    w.m_floats[0] = fVar18 - fVar12;
    w.m_floats[2] = fVar14 - fVar16;
    w.m_floats[3] = 0.0;
    fVar16 = (this->m_cachedSeparatingAxis).m_floats[2] * (fVar14 - fVar16) +
             (fVar18 - fVar12) * (this->m_cachedSeparatingAxis).m_floats[0] +
             (fVar19 - fVar25) * (this->m_cachedSeparatingAxis).m_floats[1];
    if ((0.0 < fVar16) && (input->m_maximumDistanceSquared * local_1e8 < fVar16 * fVar16)) {
      iVar10 = 10;
LAB_0017d452:
      this->m_degenerateSimplex = iVar10;
      btVoronoiSimplexSolver::compute_points
                (this->m_simplexSolver,&seperatingAxisInA,&seperatingAxisInB);
      local_1f8 = *(ulong *)pbVar1->m_floats;
      uStack_1f0 = *(ulong *)((this->m_cachedSeparatingAxis).m_floats + 2);
      fVar16 = (this->m_cachedSeparatingAxis).m_floats[0];
      fVar12 = (this->m_cachedSeparatingAxis).m_floats[1];
      fVar15 = (this->m_cachedSeparatingAxis).m_floats[2];
      fVar16 = fVar15 * fVar15 + fVar16 * fVar16 + fVar12 * fVar12;
      if (fVar16 < 0.0001) {
        this->m_degenerateSimplex = 5;
      }
      if (fVar16 <= 1.4210855e-14) {
        this->m_lastUsedMethod = 2;
        goto LAB_0017d5c5;
      }
      fVar16 = 1.0 / SQRT(fVar16);
      local_1f8 = CONCAT44(fVar16 * (float)(local_1f8 >> 0x20),fVar16 * (float)local_1f8);
      uStack_1f0._4_4_ = (undefined4)(uStack_1f0 >> 0x20);
      uStack_1f0 = CONCAT44(uStack_1f0._4_4_,(float)uStack_1f0 * fVar16);
      if (local_1e8 < 0.0) {
        local_1e8 = sqrtf(local_1e8);
      }
      else {
        local_1e8 = SQRT(local_1e8);
      }
      bVar30.m_floats = seperatingAxisInA.m_floats;
      bVar29.m_floats = seperatingAxisInB.m_floats;
      fVar15 = fVar28 / local_1e8;
      fVar12 = (this->m_cachedSeparatingAxis).m_floats[2];
      uVar2 = *(undefined8 *)(this->m_cachedSeparatingAxis).m_floats;
      fVar25 = (float)uVar2;
      fVar20 = (float)((ulong)uVar2 >> 0x20);
      fVar14 = seperatingAxisInA.m_floats[0];
      seperatingAxisInA.m_floats[1] = seperatingAxisInA.m_floats[1] - fVar15 * fVar20;
      seperatingAxisInA.m_floats[0] = fVar14 - fVar15 * fVar25;
      seperatingAxisInA.m_floats[2] = bVar30.m_floats[2];
      seperatingAxisInA.m_floats[3] = bVar30.m_floats[3];
      seperatingAxisInA.m_floats[2] = seperatingAxisInA.m_floats[2] - fVar15 * fVar12;
      local_1e8 = fVar13 / local_1e8;
      fVar15 = seperatingAxisInB.m_floats[0];
      seperatingAxisInB.m_floats[1] = seperatingAxisInB.m_floats[1] + local_1e8 * fVar20;
      seperatingAxisInB.m_floats[0] = fVar15 + local_1e8 * fVar25;
      seperatingAxisInB.m_floats[2] = bVar29.m_floats[2];
      seperatingAxisInB.m_floats[3] = bVar29.m_floats[3];
      seperatingAxisInB.m_floats[2] = fVar12 * local_1e8 + seperatingAxisInB.m_floats[2];
      fVar16 = 1.0 / fVar16 - fVar21;
      this->m_lastUsedMethod = 1;
      bVar11 = true;
      goto LAB_0017d5ca;
    }
    local_108 = CONCAT44(local_108._4_4_,fVar16);
    bVar9 = btVoronoiSimplexSolver::inSimplex(this->m_simplexSolver,&w);
    if (bVar9) {
      iVar10 = 1;
      goto LAB_0017d452;
    }
    if (local_1e8 - (float)local_108 <= local_1e8 * 1e-06) {
      iVar10 = (uint)(0.0 < local_1e8 - (float)local_108) * 9 + 2;
      goto LAB_0017d452;
    }
    btVoronoiSimplexSolver::addVertex(this->m_simplexSolver,&w,&tmpPointOnA,&qWorld);
    bVar9 = btVoronoiSimplexSolver::closest(this->m_simplexSolver,&newCachedSeparatingAxis);
    if (!bVar9) {
      iVar10 = 3;
      goto LAB_0017d452;
    }
    fVar16 = newCachedSeparatingAxis.m_floats[2] * newCachedSeparatingAxis.m_floats[2] +
             newCachedSeparatingAxis.m_floats[0] * newCachedSeparatingAxis.m_floats[0] +
             newCachedSeparatingAxis.m_floats[1] * newCachedSeparatingAxis.m_floats[1];
    if (fVar16 < 1e-06) {
      *(undefined8 *)pbVar1->m_floats = newCachedSeparatingAxis.m_floats._0_8_;
      *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2) =
           newCachedSeparatingAxis.m_floats._8_8_;
      iVar10 = 6;
      goto LAB_0017d452;
    }
    if (local_1e8 - fVar16 <= local_1e8 * 1.1920929e-07) {
      iVar10 = 0xc;
      local_1e8 = fVar16;
      goto LAB_0017d452;
    }
    *(undefined8 *)pbVar1->m_floats = newCachedSeparatingAxis.m_floats._0_8_;
    *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2) =
         newCachedSeparatingAxis.m_floats._8_8_;
    iVar10 = this->m_curIter;
    this->m_curIter = iVar10 + 1;
    if (1000 < iVar10) goto LAB_0017d5c5;
    local_1e8 = fVar16;
  } while (this->m_simplexSolver->m_numVertices != 4);
  this->m_degenerateSimplex = 0xd;
LAB_0017d5c5:
  fVar16 = 0.0;
  bVar11 = false;
LAB_0017d5ca:
  pbVar6 = this->m_penetrationDepthSolver;
  bVar9 = true;
  if (((this->m_catchDegeneracies != 0) && (pbVar6 != (btConvexPenetrationDepthSolver *)0x0)) &&
     (this->m_degenerateSimplex != 0)) {
    bVar9 = 0.01 <= fVar21 + fVar16;
  }
  fVar12 = fVar16;
  if (!(bool)(bVar9 & bVar11) && pbVar6 != (btConvexPenetrationDepthSolver *)0x0) {
    gNumDeepPenetrationChecks = gNumDeepPenetrationChecks + 1;
    pbVar1->m_floats[0] = 0.0;
    pbVar1->m_floats[1] = 0.0;
    (this->m_cachedSeparatingAxis).m_floats[2] = 0.0;
    (this->m_cachedSeparatingAxis).m_floats[3] = 0.0;
    iVar10 = (*pbVar6->_vptr_btConvexPenetrationDepthSolver[2])
                       (pbVar6,this->m_simplexSolver,this->m_minkowskiA,this->m_minkowskiB,
                        &local_148,&local_188,pbVar1,&tmpPointOnA,&qWorld,debugDraw);
    if ((char)iVar10 == '\0') {
      uVar2 = *(undefined8 *)(this->m_cachedSeparatingAxis).m_floats;
      fVar25 = (float)uVar2;
      fVar20 = (float)((ulong)uVar2 >> 0x20);
      fVar15 = (this->m_cachedSeparatingAxis).m_floats[2];
      if (0.0 < fVar15 * fVar15 + fVar25 * fVar25 + fVar20 * fVar20) {
        fVar21 = SQRT((tmpPointOnA.m_floats[2] - qWorld.m_floats[2]) *
                      (tmpPointOnA.m_floats[2] - qWorld.m_floats[2]) +
                      (tmpPointOnA.m_floats[0] - qWorld.m_floats[0]) *
                      (tmpPointOnA.m_floats[0] - qWorld.m_floats[0]) +
                      (tmpPointOnA.m_floats[1] - qWorld.m_floats[1]) *
                      (tmpPointOnA.m_floats[1] - qWorld.m_floats[1])) - fVar21;
        if ((!bVar11) || (iVar10 = 5, fVar21 < fVar16)) {
          seperatingAxisInA.m_floats[1] = tmpPointOnA.m_floats[1] - fVar28 * fVar20;
          seperatingAxisInA.m_floats[0] = tmpPointOnA.m_floats[0] - fVar28 * fVar25;
          seperatingAxisInA.m_floats[3] = tmpPointOnA.m_floats[3];
          seperatingAxisInA.m_floats[2] = tmpPointOnA.m_floats[2] - fVar28 * fVar15;
          seperatingAxisInB.m_floats[1] = qWorld.m_floats[1] + fVar13 * fVar20;
          seperatingAxisInB.m_floats[0] = qWorld.m_floats[0] + fVar13 * fVar25;
          seperatingAxisInB.m_floats[3] = qWorld.m_floats[3];
          seperatingAxisInB.m_floats[2] = fVar15 * fVar13 + qWorld.m_floats[2];
          uVar2 = *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2);
          uStack_1f0._0_4_ = (float)uVar2;
          fVar13 = (float)*(undefined8 *)pbVar1->m_floats;
          fVar28 = (float)((ulong)*(undefined8 *)pbVar1->m_floats >> 0x20);
          fVar16 = 1.0 / SQRT((float)uStack_1f0 * (float)uStack_1f0 +
                              fVar13 * fVar13 + fVar28 * fVar28);
          local_1f8 = CONCAT44(fVar16 * fVar28,fVar16 * fVar13);
          uStack_1f0._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
          uStack_1f0 = CONCAT44(uStack_1f0._4_4_,(float)uStack_1f0 * fVar16);
          bVar11 = true;
          iVar10 = 6;
          fVar12 = fVar21;
        }
        this->m_lastUsedMethod = iVar10;
      }
    }
    else {
      fVar28 = qWorld.m_floats[0] - tmpPointOnA.m_floats[0];
      fVar21 = qWorld.m_floats[1] - tmpPointOnA.m_floats[1];
      fVar15 = qWorld.m_floats[2] - tmpPointOnA.m_floats[2];
      fVar13 = fVar15 * fVar15 + fVar28 * fVar28 + fVar21 * fVar21;
      if (fVar13 <= 1.4210855e-14) {
        uVar2 = *(undefined8 *)(this->m_cachedSeparatingAxis).m_floats;
        fVar28 = (float)uVar2;
        fVar21 = (float)((ulong)uVar2 >> 0x20);
        uVar5 = *(ulong *)((this->m_cachedSeparatingAxis).m_floats + 2);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar5;
        fVar13 = (float)uVar5;
        fVar13 = fVar13 * fVar13 + fVar28 * fVar28 + fVar21 * fVar21;
      }
      else {
        auVar26 = ZEXT416((uint)fVar15);
      }
      if (fVar13 <= 1.4210855e-14) {
        this->m_lastUsedMethod = 9;
      }
      else {
        if (fVar13 < 0.0) {
          local_108 = CONCAT44(fVar21,fVar28);
          uStack_100 = 0;
          _local_f8 = auVar26;
          fVar13 = sqrtf(fVar13);
          auVar26 = _local_f8;
          fVar28 = (float)local_108;
          fVar21 = local_108._4_4_;
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        fVar12 = -SQRT((tmpPointOnA.m_floats[2] - qWorld.m_floats[2]) *
                       (tmpPointOnA.m_floats[2] - qWorld.m_floats[2]) +
                       (tmpPointOnA.m_floats[0] - qWorld.m_floats[0]) *
                       (tmpPointOnA.m_floats[0] - qWorld.m_floats[0]) +
                       (tmpPointOnA.m_floats[1] - qWorld.m_floats[1]) *
                       (tmpPointOnA.m_floats[1] - qWorld.m_floats[1]));
        this->m_lastUsedMethod = 3;
        if ((!bVar11) || (fVar12 < fVar16)) {
          fVar13 = 1.0 / fVar13;
          fVar16 = auVar26._0_4_ * fVar13;
          auVar27._0_4_ = auVar26._0_4_ * fVar13;
          auVar27._4_12_ = auVar26._4_12_;
          fVar28 = fVar28 * fVar13;
          fVar21 = fVar21 * fVar13;
          seperatingAxisInA = tmpPointOnA;
          seperatingAxisInB = qWorld;
          local_1f8 = CONCAT44(fVar21,fVar28);
          uStack_1f0 = auVar27._0_8_;
          uVar2 = *(undefined8 *)(input->m_transformA).m_basis.m_el[0].m_floats;
          uVar3 = *(undefined8 *)(input->m_transformA).m_basis.m_el[1].m_floats;
          uVar4 = *(undefined8 *)(input->m_transformA).m_basis.m_el[2].m_floats;
          w.m_floats[0] = (float)uVar4 * fVar16 + fVar28 * (float)uVar2 + (float)uVar3 * fVar21;
          w.m_floats[1] =
               (float)((ulong)uVar4 >> 0x20) * fVar16 +
               fVar28 * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar3 >> 0x20) * fVar21;
          w.m_floats[2] =
               (input->m_transformA).m_basis.m_el[2].m_floats[2] * fVar16 +
               (input->m_transformA).m_basis.m_el[0].m_floats[2] * fVar28 +
               (input->m_transformA).m_basis.m_el[1].m_floats[2] * fVar21;
          w.m_floats[3] = 0.0;
          fVar13 = -fVar28;
          uVar2 = *(undefined8 *)(input->m_transformB).m_basis.m_el[0].m_floats;
          uVar3 = *(undefined8 *)(input->m_transformB).m_basis.m_el[1].m_floats;
          uVar4 = *(undefined8 *)(input->m_transformB).m_basis.m_el[2].m_floats;
          uVar17 = 0;
          newCachedSeparatingAxis.m_floats[1] =
               (fVar13 * (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar3 >> 0x20) * fVar21) -
               (float)((ulong)uVar4 >> 0x20) * fVar16;
          newCachedSeparatingAxis.m_floats[0] =
               (fVar13 * (float)uVar2 - (float)uVar3 * fVar21) - (float)uVar4 * fVar16;
          newCachedSeparatingAxis.m_floats[2] =
               ((input->m_transformB).m_basis.m_el[0].m_floats[2] * fVar13 -
               (input->m_transformB).m_basis.m_el[1].m_floats[2] * fVar21) -
               fVar16 * (input->m_transformB).m_basis.m_el[2].m_floats[2];
          newCachedSeparatingAxis.m_floats[3] = 0.0;
          bVar29 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                             (this->m_minkowskiA,&w);
          local_108 = bVar29.m_floats._8_8_;
          uStack_f0 = extraout_XMM0_Qb_00;
          local_f8 = (undefined1  [8])bVar29.m_floats._0_8_;
          uStack_100 = uVar17;
          bVar29 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                             (this->m_minkowskiB,&newCachedSeparatingAxis);
          fVar15 = bVar29.m_floats[0];
          fVar25 = bVar29.m_floats[1];
          uVar7 = local_f8._0_4_;
          uVar8 = local_f8._4_4_;
          fVar13 = (float)local_108;
          fVar16 = local_108._4_4_;
          fVar20 = bVar29.m_floats[2];
          fVar14 = (float)local_138 * local_108._4_4_;
          local_108 = CONCAT44((float)local_158 +
                               (float)uStack_180 * fVar20 +
                               (float)local_188 * fVar15 + local_188._4_4_ * fVar25,
                               (float)local_118 +
                               (float)uStack_140 * (float)local_108 +
                               (float)local_148 * (float)local_f8._0_4_ +
                               local_148._4_4_ * (float)local_f8._4_4_);
          uStack_100 = CONCAT44(fStack_10c +
                                local_138._4_4_ * bVar29.m_floats[3] +
                                uStack_140._4_4_ * fVar25 + (float)local_138 * uStack_f0._4_4_,
                                fStack_110 +
                                fVar14 + (float)uStack_140 * (float)local_f8._4_4_ +
                                         uStack_140._4_4_ * (float)uStack_f0);
          fVar14 = local_138._4_4_ * (float)local_f8._4_4_;
          fVar18 = (float)uStack_130 * (float)local_f8._4_4_;
          local_f8._4_4_ =
               local_158._4_4_ +
               (float)uStack_170 * fVar20 + (float)local_178 * fVar15 + local_178._4_4_ * fVar25;
          local_f8._0_4_ =
               local_118._4_4_ +
               (float)uStack_130 * fVar13 + (float)local_138 * (float)local_f8._0_4_ + fVar14;
          uStack_f0._0_4_ =
               (float)local_128 * fVar16 + fVar18 + uStack_130._4_4_ * (float)uStack_f0 + 0.0;
          uStack_f0._4_4_ =
               local_128._4_4_ * bVar29.m_floats[3] +
               uStack_130._4_4_ * fVar25 + (float)local_128 * uStack_f0._4_4_ + 0.0;
          fVar14 = fStack_110 +
                   (float)uStack_120 * fVar13 +
                   (float)local_128 * (float)uVar7 + local_128._4_4_ * (float)uVar8;
          fVar20 = fStack_150 +
                   (float)uStack_160 * fVar20 + (float)local_168 * fVar15 + local_168._4_4_ * fVar25
          ;
          fVar25 = -fVar28;
          uVar2 = *(undefined8 *)(input->m_transformA).m_basis.m_el[0].m_floats;
          uVar3 = *(undefined8 *)(input->m_transformA).m_basis.m_el[1].m_floats;
          uVar4 = *(undefined8 *)(input->m_transformA).m_basis.m_el[2].m_floats;
          w.m_floats[1] =
               (fVar25 * (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar3 >> 0x20) * fVar21) -
               (float)((ulong)uVar4 >> 0x20) * auVar27._0_4_;
          w.m_floats[0] =
               (fVar25 * (float)uVar2 - (float)uVar3 * fVar21) - (float)uVar4 * auVar27._0_4_;
          w.m_floats[2] =
               ((input->m_transformA).m_basis.m_el[0].m_floats[2] * fVar25 -
               (input->m_transformA).m_basis.m_el[1].m_floats[2] * fVar21) -
               (input->m_transformA).m_basis.m_el[2].m_floats[2] * auVar27._0_4_;
          w.m_floats[3] = 0.0;
          uVar2 = *(undefined8 *)(input->m_transformB).m_basis.m_el[0].m_floats;
          uVar3 = *(undefined8 *)(input->m_transformB).m_basis.m_el[1].m_floats;
          uVar4 = *(undefined8 *)(input->m_transformB).m_basis.m_el[2].m_floats;
          newCachedSeparatingAxis.m_floats[0] =
               (float)uVar4 * auVar27._0_4_ + fVar28 * (float)uVar2 + (float)uVar3 * fVar21;
          newCachedSeparatingAxis.m_floats[1] =
               (float)((ulong)uVar4 >> 0x20) * auVar27._0_4_ +
               fVar28 * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar3 >> 0x20) * fVar21;
          newCachedSeparatingAxis.m_floats[2] =
               auVar27._0_4_ * (input->m_transformB).m_basis.m_el[2].m_floats[2] +
               fVar28 * (input->m_transformB).m_basis.m_el[0].m_floats[2] +
               fVar21 * (input->m_transformB).m_basis.m_el[1].m_floats[2];
          newCachedSeparatingAxis.m_floats[3] = 0.0;
          bVar29 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                             (this->m_minkowskiA,&w);
          bVar30 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                             (this->m_minkowskiB,&newCachedSeparatingAxis);
          fVar13 = bVar30.m_floats[0];
          fVar16 = bVar30.m_floats[1];
          local_78 = bVar29.m_floats[0];
          fStack_74 = bVar29.m_floats[1];
          local_68 = bVar29.m_floats[2];
          fVar15 = bVar30.m_floats[2];
          bVar11 = true;
          if (auVar27._0_4_ *
              ((fStack_110 +
               (float)uStack_120 * local_68 +
               (float)local_128 * local_78 + local_128._4_4_ * fStack_74) -
              (fStack_150 +
              (float)uStack_160 * fVar15 + (float)local_168 * fVar13 + local_168._4_4_ * fVar16)) +
              fVar28 * (((float)local_118 +
                        (float)uStack_140 * local_68 +
                        (float)local_148 * local_78 + local_148._4_4_ * fStack_74) -
                       ((float)local_158 +
                       (float)uStack_180 * fVar15 +
                       (float)local_188 * fVar13 + local_188._4_4_ * fVar16)) +
              fVar21 * ((local_118._4_4_ +
                        (float)uStack_130 * local_68 +
                        (float)local_138 * local_78 + local_138._4_4_ * fStack_74) -
                       (local_158._4_4_ +
                       (float)uStack_170 * fVar15 +
                       (float)local_178 * fVar13 + local_178._4_4_ * fVar16)) <
              -auVar27._0_4_ * (fVar14 - fVar20) +
              fVar25 * ((float)local_108 - local_108._4_4_) +
              -fVar21 * ((float)local_f8._0_4_ - (float)local_f8._4_4_)) {
            this->m_lastUsedMethod = 10;
            local_1f8 = CONCAT44(fVar21,fVar28) ^ 0x8000000080000000;
            uStack_1f0._4_4_ = auVar26._4_4_;
            uStack_1f0 = CONCAT44(uStack_1f0._4_4_,auVar27._0_4_) ^ 0x80000000;
          }
        }
        else {
          this->m_lastUsedMethod = 8;
          fVar12 = fVar16;
        }
      }
    }
  }
  if ((bVar11) && ((fVar12 < 0.0 || (fVar12 * fVar12 < input->m_maximumDistanceSquared)))) {
    *(ulong *)pbVar1->m_floats = local_1f8;
    *(ulong *)((this->m_cachedSeparatingAxis).m_floats + 2) = uStack_1f0;
    this->m_cachedSeparatingDistance = fVar12;
    tmpPointOnA.m_floats[0] = fVar22 + seperatingAxisInB.m_floats[0];
    tmpPointOnA.m_floats[1] = fVar23 + seperatingAxisInB.m_floats[1];
    tmpPointOnA.m_floats[2] = fVar24 + seperatingAxisInB.m_floats[2];
    tmpPointOnA.m_floats[3] = 0.0;
    (*output->_vptr_Result[4])();
  }
  return;
}

Assistant:

void btGjkPairDetector::getClosestPointsNonVirtual(const ClosestPointInput& input, Result& output, class btIDebugDraw* debugDraw)
#endif
{
	m_cachedSeparatingDistance = 0.f;

	btScalar distance=btScalar(0.);
	btVector3	normalInB(btScalar(0.),btScalar(0.),btScalar(0.));

	btVector3 pointOnA,pointOnB;
	btTransform	localTransA = input.m_transformA;
	btTransform localTransB = input.m_transformB;
	btVector3 positionOffset=(localTransA.getOrigin() + localTransB.getOrigin()) * btScalar(0.5);
	localTransA.getOrigin() -= positionOffset;
	localTransB.getOrigin() -= positionOffset;

	bool check2d = m_minkowskiA->isConvex2d() && m_minkowskiB->isConvex2d();

	btScalar marginA = m_marginA;
	btScalar marginB = m_marginB;

	gNumGjkChecks++;

	//for CCD we don't use margins
	if (m_ignoreMargin)
	{
		marginA = btScalar(0.);
		marginB = btScalar(0.);
	}

	m_curIter = 0;
	int gGjkMaxIter = 1000;//this is to catch invalid input, perhaps check for #NaN?
	m_cachedSeparatingAxis.setValue(0,1,0);

	bool isValid = false;
	bool checkSimplex = false;
	bool checkPenetration = true;
	m_degenerateSimplex = 0;

	m_lastUsedMethod = -1;

	{
		btScalar squaredDistance = BT_LARGE_FLOAT;
		btScalar delta = btScalar(0.);
		
		btScalar margin = marginA + marginB;
		
		

		m_simplexSolver->reset();
		
		for ( ; ; )
		//while (true)
		{

			btVector3 seperatingAxisInA = (-m_cachedSeparatingAxis)* input.m_transformA.getBasis();
			btVector3 seperatingAxisInB = m_cachedSeparatingAxis* input.m_transformB.getBasis();


			btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
			btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

			btVector3  pWorld = localTransA(pInA);	
			btVector3  qWorld = localTransB(qInB);


			if (check2d)
			{
				pWorld[2] = 0.f;
				qWorld[2] = 0.f;
			}

			btVector3 w	= pWorld - qWorld;
			delta = m_cachedSeparatingAxis.dot(w);

			// potential exit, they don't overlap
			if ((delta > btScalar(0.0)) && (delta * delta > squaredDistance * input.m_maximumDistanceSquared)) 
			{
				m_degenerateSimplex = 10;
				checkSimplex=true;
				//checkPenetration = false;
				break;
			}

			//exit 0: the new point is already in the simplex, or we didn't come any closer
			if (m_simplexSolver->inSimplex(w))
			{
				m_degenerateSimplex = 1;
				checkSimplex = true;
				break;
			}
			// are we getting any closer ?
			btScalar f0 = squaredDistance - delta;
			btScalar f1 = squaredDistance * REL_ERROR2;

			if (f0 <= f1)
			{
				if (f0 <= btScalar(0.))
				{
					m_degenerateSimplex = 2;
				} else
				{
					m_degenerateSimplex = 11;
				}
				checkSimplex = true;
				break;
			}

			//add current vertex to simplex
			m_simplexSolver->addVertex(w, pWorld, qWorld);
			btVector3 newCachedSeparatingAxis;

			//calculate the closest point to the origin (update vector v)
			if (!m_simplexSolver->closest(newCachedSeparatingAxis))
			{
				m_degenerateSimplex = 3;
				checkSimplex = true;
				break;
			}

			if(newCachedSeparatingAxis.length2()<REL_ERROR2)
            {
				m_cachedSeparatingAxis = newCachedSeparatingAxis;
                m_degenerateSimplex = 6;
                checkSimplex = true;
                break;
            }

			btScalar previousSquaredDistance = squaredDistance;
			squaredDistance = newCachedSeparatingAxis.length2();
#if 0
///warning: this termination condition leads to some problems in 2d test case see Bullet/Demos/Box2dDemo
			if (squaredDistance>previousSquaredDistance)
			{
				m_degenerateSimplex = 7;
				squaredDistance = previousSquaredDistance;
                checkSimplex = false;
                break;
			}
#endif //
			

			//redundant m_simplexSolver->compute_points(pointOnA, pointOnB);

			//are we getting any closer ?
			if (previousSquaredDistance - squaredDistance <= SIMD_EPSILON * previousSquaredDistance) 
			{ 
//				m_simplexSolver->backup_closest(m_cachedSeparatingAxis);
				checkSimplex = true;
				m_degenerateSimplex = 12;
				
				break;
			}

			m_cachedSeparatingAxis = newCachedSeparatingAxis;

			  //degeneracy, this is typically due to invalid/uninitialized worldtransforms for a btCollisionObject   
              if (m_curIter++ > gGjkMaxIter)   
              {   
                      #if defined(DEBUG) || defined (_DEBUG)

                              printf("btGjkPairDetector maxIter exceeded:%i\n",m_curIter);   
                              printf("sepAxis=(%f,%f,%f), squaredDistance = %f, shapeTypeA=%i,shapeTypeB=%i\n",   
                              m_cachedSeparatingAxis.getX(),   
                              m_cachedSeparatingAxis.getY(),   
                              m_cachedSeparatingAxis.getZ(),   
                              squaredDistance,   
                              m_minkowskiA->getShapeType(),   
                              m_minkowskiB->getShapeType());   

                      #endif   
                      break;   

              } 


			bool check = (!m_simplexSolver->fullSimplex());
			//bool check = (!m_simplexSolver->fullSimplex() && squaredDistance > SIMD_EPSILON * m_simplexSolver->maxVertex());

			if (!check)
			{
				//do we need this backup_closest here ?
//				m_simplexSolver->backup_closest(m_cachedSeparatingAxis);
				m_degenerateSimplex = 13;
				break;
			}
		}

		if (checkSimplex)
		{
			m_simplexSolver->compute_points(pointOnA, pointOnB);
			normalInB = m_cachedSeparatingAxis;

			btScalar lenSqr =m_cachedSeparatingAxis.length2();
			
			//valid normal
			if (lenSqr < 0.0001)
			{
				m_degenerateSimplex = 5;
			} 
			if (lenSqr > SIMD_EPSILON*SIMD_EPSILON)
			{
				btScalar rlen = btScalar(1.) / btSqrt(lenSqr );
				normalInB *= rlen; //normalize

				btScalar s = btSqrt(squaredDistance);
			
				btAssert(s > btScalar(0.0));
				pointOnA -= m_cachedSeparatingAxis * (marginA / s);
				pointOnB += m_cachedSeparatingAxis * (marginB / s);
				distance = ((btScalar(1.)/rlen) - margin);
				isValid = true;
				
				m_lastUsedMethod = 1;
			} else
			{
				m_lastUsedMethod = 2;
			}
		}

		bool catchDegeneratePenetrationCase = 
			(m_catchDegeneracies && m_penetrationDepthSolver && m_degenerateSimplex && ((distance+margin) < 0.01));

		//if (checkPenetration && !isValid)
		if (checkPenetration && (!isValid || catchDegeneratePenetrationCase ))
		{
			//penetration case

			//if there is no way to handle penetrations, bail out
			if (m_penetrationDepthSolver)
			{
				// Penetration depth case.
				btVector3 tmpPointOnA,tmpPointOnB;
				
				gNumDeepPenetrationChecks++;
				m_cachedSeparatingAxis.setZero();

				bool isValid2 = m_penetrationDepthSolver->calcPenDepth( 
					*m_simplexSolver, 
					m_minkowskiA,m_minkowskiB,
					localTransA,localTransB,
					m_cachedSeparatingAxis, tmpPointOnA, tmpPointOnB,
					debugDraw
					);


				if (isValid2)
				{
					btVector3 tmpNormalInB = tmpPointOnB-tmpPointOnA;
					btScalar lenSqr = tmpNormalInB.length2();
					if (lenSqr <= (SIMD_EPSILON*SIMD_EPSILON))
					{
						tmpNormalInB = m_cachedSeparatingAxis;
						lenSqr = m_cachedSeparatingAxis.length2();
					}

					if (lenSqr > (SIMD_EPSILON*SIMD_EPSILON))
					{
						tmpNormalInB /= btSqrt(lenSqr);
						btScalar distance2 = -(tmpPointOnA-tmpPointOnB).length();
						m_lastUsedMethod = 3;
						//only replace valid penetrations when the result is deeper (check)
						if (!isValid || (distance2 < distance))
						{
							distance = distance2;
							pointOnA = tmpPointOnA;
							pointOnB = tmpPointOnB;
							normalInB = tmpNormalInB;
							///todo: need to track down this EPA penetration solver degeneracy
							///the penetration solver reports penetration but the contact normal
							///connecting the contact points is pointing in the opposite direction
							///until then, detect the issue and revert the normal
							{
								btScalar d1=0;
								{
									btVector3 seperatingAxisInA = (normalInB)* input.m_transformA.getBasis();
									btVector3 seperatingAxisInB = -normalInB* input.m_transformB.getBasis();
								

									btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
									btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

									btVector3  pWorld = localTransA(pInA);	
									btVector3  qWorld = localTransB(qInB);
									btVector3 w	= pWorld - qWorld;
									d1 = (-normalInB).dot(w);
								}
								btScalar d0 = 0.f;
								{
									btVector3 seperatingAxisInA = (-normalInB)* input.m_transformA.getBasis();
									btVector3 seperatingAxisInB = normalInB* input.m_transformB.getBasis();
								

									btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
									btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

									btVector3  pWorld = localTransA(pInA);	
									btVector3  qWorld = localTransB(qInB);
									btVector3 w	= pWorld - qWorld;
									d0 = normalInB.dot(w);
								}
								if (d1>d0)
								{
									m_lastUsedMethod = 10;
									normalInB*=-1;
								} 

							}
							isValid = true;
							
						} else
						{
							m_lastUsedMethod = 8;
						}
					} else
					{
						m_lastUsedMethod = 9;
					}
				} else

				{
					///this is another degenerate case, where the initial GJK calculation reports a degenerate case
					///EPA reports no penetration, and the second GJK (using the supporting vector without margin)
					///reports a valid positive distance. Use the results of the second GJK instead of failing.
					///thanks to Jacob.Langford for the reproduction case
					///http://code.google.com/p/bullet/issues/detail?id=250

				
					if (m_cachedSeparatingAxis.length2() > btScalar(0.))
					{
						btScalar distance2 = (tmpPointOnA-tmpPointOnB).length()-margin;
						//only replace valid distances when the distance is less
						if (!isValid || (distance2 < distance))
						{
							distance = distance2;
							pointOnA = tmpPointOnA;
							pointOnB = tmpPointOnB;
							pointOnA -= m_cachedSeparatingAxis * marginA ;
							pointOnB += m_cachedSeparatingAxis * marginB ;
							normalInB = m_cachedSeparatingAxis;
							normalInB.normalize();

							isValid = true;
							m_lastUsedMethod = 6;
						} else
						{
							m_lastUsedMethod = 5;
						}
					}
				}
				
			}

		}
	}

	

	if (isValid && ((distance < 0) || (distance*distance < input.m_maximumDistanceSquared)))
	{

		m_cachedSeparatingAxis = normalInB;
		m_cachedSeparatingDistance = distance;

		output.addContactPoint(
			normalInB,
			pointOnB+positionOffset,
			distance);

	}


}